

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::copytexsubimage3d_neg_width_height
               (NegativeTestContext *ctx)

{
  allocator<char> local_35;
  GLuint texture;
  string local_30;
  
  texture = 0x1234;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texture);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x806f,texture);
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x806f,0,0x1908,4,4,4,0,0x1908,0x1401,(void *)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_INVALID_VALUE is generated if width < 0.",&local_35);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glCopyTexSubImage3D(&ctx->super_CallLogWrapper,0x806f,0,0,0,0,0,0,-4,4);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_INVALID_VALUE is generated if height < 0.",&local_35);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glCopyTexSubImage3D(&ctx->super_CallLogWrapper,0x806f,0,0,0,0,0,0,4,-4);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&texture);
  return;
}

Assistant:

void copytexsubimage3d_neg_width_height (NegativeTestContext& ctx)
{
	GLuint texture = 0x1234;
	ctx.glGenTextures	(1, &texture);
	ctx.glBindTexture	(GL_TEXTURE_3D, texture);
	ctx.glTexImage3D	(GL_TEXTURE_3D, 0, GL_RGBA, 4, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);

	ctx.beginSection("GL_INVALID_VALUE is generated if width < 0.");
	ctx.glCopyTexSubImage3D(GL_TEXTURE_3D, 0, 0, 0, 0, 0, 0, -4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if height < 0.");
	ctx.glCopyTexSubImage3D(GL_TEXTURE_3D, 0, 0, 0, 0, 0, 0, 4, -4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}